

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase392::run(TestCase392 *this)

{
  size_t sVar1;
  size_t sVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar4;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments;
  ArrayPtr<const_unsigned_char> packedBytes;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_00;
  ArrayPtr<const_unsigned_char> packedBytes_00;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_01;
  ReaderOptions options;
  ArrayPtr<capnp::word> scratchSpace;
  TestPipe pipe;
  TestMessageBuilder builder;
  PackedMessageReader reader;
  word scratch [1024];
  undefined1 local_2308 [8];
  OutputStream OStack_2300;
  WirePointer *local_22f8;
  _Alloc_hider local_22f0;
  uchar *local_22e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_22e0;
  size_type local_22d0;
  Reader local_22c8;
  StructReader local_22a8;
  PointerReader local_2278;
  undefined **local_2250;
  StructReader in_stack_ffffffffffffddc0;
  PackedMessageReader local_2158;
  StructBuilder local_2018 [205];
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  
  MallocMessageBuilder::MallocMessageBuilder((MallocMessageBuilder *)&local_2250,0,FIXED_SIZE);
  local_2250 = &PTR__TestMessageBuilder_0036db48;
  MessageBuilder::getRootInternal((Builder *)local_2308,(MessageBuilder *)&local_2250);
  local_2158.super_InputStreamMessageReader.super_MessageReader._vptr_MessageReader =
       (_func_int **)local_22f8;
  local_2158.super_PackedInputStream.super_InputStream._vptr_InputStream = (_func_int **)local_2308;
  local_2158.super_PackedInputStream.inner = (BufferedInputStream *)OStack_2300._vptr_OutputStream;
  PointerBuilder::initStruct(local_2018,(PointerBuilder *)&local_2158,(StructSize)0x140006);
  paVar3 = &local_22e0;
  local_2308 = (undefined1  [8])&PTR__TestPipe_0036da70;
  OStack_2300._vptr_OutputStream = (_func_int **)&PTR__TestPipe_0036dab0;
  local_22f8 = (WirePointer *)0xffffffffffffffff;
  local_22e8 = (uchar *)0x0;
  local_22e0._M_local_buf[0] = '\0';
  local_22d0 = 0;
  local_22f0._M_p = (pointer)paVar3;
  AVar4 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&local_2250);
  segments_01.ptr = (ArrayPtr<const_capnp::word> *)AVar4.size_;
  segments_01.size_ = (size_t)paVar3;
  writePackedMessage((capnp *)&OStack_2300,(OutputStream *)AVar4.ptr,segments_01);
  AVar4 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&local_2250);
  segments.size_ = (ArrayPtr<const_capnp::word> *)AVar4.size_;
  segments.ptr = segments.size_;
  sVar1 = computeSerializedSizeInWords((capnp *)AVar4.ptr,segments);
  packedBytes.size_ = extraout_RDX;
  packedBytes.ptr = local_22e8;
  sVar2 = computeUnpackedSizeInWords((capnp *)local_22f0._M_p,packedBytes);
  if ((sVar1 != sVar2) && (kj::_::Debug::minSeverity < 3)) {
    AVar4 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&local_2250);
    segments_00.size_ = (ArrayPtr<const_capnp::word> *)AVar4.size_;
    segments_00.ptr = segments_00.size_;
    local_2018[0].segment =
         (SegmentBuilder *)computeSerializedSizeInWords((capnp *)AVar4.ptr,segments_00);
    packedBytes_00.size_ = extraout_RDX_00;
    packedBytes_00.ptr = local_22e8;
    local_2158.super_PackedInputStream.super_InputStream._vptr_InputStream =
         (_func_int **)computeUnpackedSizeInWords((capnp *)local_22f0._M_p,packedBytes_00);
    kj::_::Debug::log<char_const(&)[106],unsigned_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-packed-test.c++"
               ,399,ERROR,
               "\"failed: expected \" \"(computeSerializedSizeInWords(builder)) == (computeUnpackedSizeInWords(pipe.getArray()))\", computeSerializedSizeInWords(builder), computeUnpackedSizeInWords(pipe.getArray())"
               ,(char (*) [106])
                "failed: expected (computeSerializedSizeInWords(builder)) == (computeUnpackedSizeInWords(pipe.getArray()))"
               ,(unsigned_long *)local_2018,(unsigned_long *)&local_2158);
  }
  options._8_8_ = 0x40;
  options.traversalLimitInWords = 0x800000;
  scratchSpace.size_ = 0x400;
  scratchSpace.ptr = (word *)local_2018;
  PackedMessageReader::PackedMessageReader
            (&local_2158,(BufferedInputStream *)local_2308,options,scratchSpace);
  MessageReader::getRootInternal
            (&local_22c8,&local_2158.super_InputStreamMessageReader.super_MessageReader);
  local_2278.pointer = local_22c8.reader.pointer;
  local_2278.nestingLimit = local_22c8.reader.nestingLimit;
  local_2278._28_4_ = local_22c8.reader._28_4_;
  local_2278.segment = local_22c8.reader.segment;
  local_2278.capTable = local_22c8.reader.capTable;
  PointerReader::getStruct(&local_22a8,&local_2278,(word *)0x0);
  checkTestMessageAllZero((Reader)in_stack_ffffffffffffddc0);
  PackedMessageReader::~PackedMessageReader(&local_2158);
  TestPipe::~TestPipe((TestPipe *)local_2308);
  TestMessageBuilder::~TestMessageBuilder((TestMessageBuilder *)&local_2250);
  return;
}

Assistant:

TEST(Packed, RoundTripAllZeroScratchSpace) {
  TestMessageBuilder builder(1);
  builder.initRoot<TestAllTypes>();

  TestPipe pipe;
  writePackedMessage(pipe, builder);

  EXPECT_EQ(computeSerializedSizeInWords(builder), computeUnpackedSizeInWords(pipe.getArray()));

  word scratch[1024];
  PackedMessageReader reader(pipe, ReaderOptions(), kj::ArrayPtr<word>(scratch, 1024));
  checkTestMessageAllZero(reader.getRoot<TestAllTypes>());
}